

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubFodderBuilders.cpp
# Opt level: O0

void __thiscall SubFodderBuilderB::SubFodderBuilderB(SubFodderBuilderB *this)

{
  Fodder *this_00;
  SubFodderBuilderB *this_local;
  
  FodderBuilder::FodderBuilder(&this->super_FodderBuilder);
  (this->super_FodderBuilder)._vptr_FodderBuilder = (_func_int **)&PTR_addIngredientA_00135aa0;
  this_00 = (Fodder *)operator_new(0x40);
  memset(this_00,0,0x40);
  Fodder::Fodder(this_00);
  this->_fodder = this_00;
  return;
}

Assistant:

SubFodderBuilderB::SubFodderBuilderB() {
	_fodder = new Fodder();
}